

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseElemModuleField(WastParser *this,Module *module)

{
  ElemSegment *this_00;
  Type *out_type;
  string_view name;
  string_view name_00;
  bool bVar1;
  bool bVar2;
  Result RVar3;
  TokenType TVar4;
  ElemSegmentModuleField *pEVar5;
  Enum EVar6;
  Var *this_01;
  string segment_name;
  Location loc;
  string initial_name;
  char *local_178;
  char *local_170;
  char local_168 [16];
  Module *local_158;
  _Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false> local_150;
  Location local_148;
  string local_128;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)&local_108,this);
  local_148.field_1.field_1.offset = local_108.loc.field_1.field_1.offset;
  local_148.field_1._8_8_ = local_108.loc.field_1._8_8_;
  local_148.filename.data_ = local_108.loc.filename.data_;
  local_148.filename.size_ = local_108.loc.filename.size_;
  RVar3 = Expect(this,Elem);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  local_158 = module;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  bVar1 = ParseBindVarOpt(this,&local_128);
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,local_128._M_dataplus._M_p,
             local_128._M_dataplus._M_p + local_128._M_string_length);
  if ((this->options_->features).bulk_memory_enabled_ == false) {
    std::__cxx11::string::_M_replace((ulong)&local_178,0,local_170,0x18beb7);
  }
  pEVar5 = (ElemSegmentModuleField *)operator_new(0xe8);
  name.size_ = (size_type)local_170;
  name.data_ = local_178;
  (pEVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
  (pEVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
  (pEVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__ModuleField_001b01b0;
  (pEVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.loc.field_1.field_1.
  offset = (size_t)local_148.field_1.field_1.offset;
  *(undefined8 *)
   ((long)&(pEVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.loc.field_1
   + 8) = local_148.field_1._8_8_;
  (pEVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.loc.filename.data_ =
       local_148.filename.data_;
  (pEVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.loc.filename.size_ =
       local_148.filename.size_;
  (pEVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.type_ = ElemSegment;
  (pEVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__ElemSegmentModuleField_001b0820;
  this_00 = &pEVar5->elem_segment;
  ElemSegment::ElemSegment(this_00,name);
  if (((this->options_->features).reference_types_enabled_ == true) &&
     (bVar2 = Match(this,Declare), bVar2)) {
    this_00->kind = Declared;
  }
  if ((this->options_->features).bulk_memory_enabled_ == true) {
    bVar1 = PeekMatchLpar(this,Table);
    if (!bVar1) {
      this_01 = &local_78;
LAB_0015e9d7:
      Var::Var(this_01,0,&local_148);
      ParseVarOpt(this,&(pEVar5->elem_segment).table_var,this_01);
      goto LAB_0015e9f7;
    }
    RVar3 = Expect(this,Lpar);
    EVar6 = Error;
    if (((RVar3.enum_ == Error) || (RVar3 = Expect(this,Table), RVar3.enum_ == Error)) ||
       (RVar3 = ParseVar(this,&(pEVar5->elem_segment).table_var), RVar3.enum_ == Error))
    goto LAB_0015eb0f;
    RVar3 = Expect(this,Rpar);
    if (RVar3.enum_ != Error) goto LAB_0015e9fc;
LAB_0015ea49:
    EVar6 = Error;
  }
  else {
    if (!bVar1) {
      this_01 = &local_c0;
      goto LAB_0015e9d7;
    }
    name_00.size_ = local_128._M_string_length;
    name_00.data_ = local_128._M_dataplus._M_p;
    this_01 = &local_108;
    Var::Var(this_01,name_00,&local_148);
    Var::operator=(&(pEVar5->elem_segment).table_var,this_01);
LAB_0015e9f7:
    Var::~Var(this_01);
LAB_0015e9fc:
    if ((this->options_->features).bulk_memory_enabled_ == true) {
      if ((this_00->kind != Declared) &&
         (bVar1 = ParseOffsetExprOpt(this,&(pEVar5->elem_segment).offset), !bVar1)) {
        this_00->kind = Passive;
      }
    }
    else {
      RVar3 = ParseOffsetExpr(this,&(pEVar5->elem_segment).offset);
      if (RVar3.enum_ == Error) goto LAB_0015ea49;
    }
    out_type = &(pEVar5->elem_segment).elem_type;
    bVar1 = ParseRefTypeOpt(this,out_type);
    if (bVar1) {
      ParseElemExprListOpt(this,&(pEVar5->elem_segment).elem_exprs);
    }
    else {
      out_type->enum_ = FuncRef;
      TVar4 = Peek(this,0);
      if (TVar4 == First_RefKind) {
        RVar3 = Expect(this,First_RefKind);
        EVar6 = Error;
        if (RVar3.enum_ == Error) goto LAB_0015eb0f;
      }
      ParseElemExprVarListOpt(this,&(pEVar5->elem_segment).elem_exprs);
    }
    RVar3 = Expect(this,Rpar);
    EVar6 = Error;
    if (RVar3.enum_ != Error) {
      local_150._M_head_impl = pEVar5;
      Module::AppendField(local_158,
                          (unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                           *)&local_150);
      if (local_150._M_head_impl != (ElemSegmentModuleField *)0x0) {
        (*((local_150._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_150._M_head_impl = (ElemSegmentModuleField *)0x0;
      pEVar5 = (ElemSegmentModuleField *)0x0;
      EVar6 = Ok;
    }
  }
LAB_0015eb0f:
  if (pEVar5 != (ElemSegmentModuleField *)0x0) {
    (*(pEVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField._vptr_ModuleField
      [1])(pEVar5);
  }
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseElemModuleField(Module* module) {
  WABT_TRACE(ParseElemModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Elem);

  // With MVP text format the name here was intended to refer to the table
  // that the elem segment was part of, but we never did anything with this name
  // since there was only one table anyway.
  // With bulk-memory enabled this introduces a new name for the particular
  // elem segment.
  std::string initial_name;
  bool has_name = ParseBindVarOpt(&initial_name);

  std::string segment_name = initial_name;
  if (!options_->features.bulk_memory_enabled()) {
    segment_name = "";
  }
  auto field = MakeUnique<ElemSegmentModuleField>(loc, segment_name);
  if (options_->features.reference_types_enabled() &&
      Match(TokenType::Declare)) {
    field->elem_segment.kind = SegmentKind::Declared;
  }

  // Optional table specifier
  if (options_->features.bulk_memory_enabled()) {
    if (PeekMatchLpar(TokenType::Table)) {
      EXPECT(Lpar);
      EXPECT(Table);
      CHECK_RESULT(ParseVar(&field->elem_segment.table_var));
      EXPECT(Rpar);
    } else {
      ParseVarOpt(&field->elem_segment.table_var, Var(0, loc));
    }
  } else {
    if (has_name) {
      field->elem_segment.table_var = Var(initial_name, loc);
    } else {
      ParseVarOpt(&field->elem_segment.table_var, Var(0, loc));
    }
  }

  // Parse offset expression, if not declared/passive segment.
  if (options_->features.bulk_memory_enabled()) {
    if (field->elem_segment.kind != SegmentKind::Declared &&
        !ParseOffsetExprOpt(&field->elem_segment.offset)) {
      field->elem_segment.kind = SegmentKind::Passive;
    }
  } else {
    CHECK_RESULT(ParseOffsetExpr(&field->elem_segment.offset));
  }

  if (ParseRefTypeOpt(&field->elem_segment.elem_type)) {
    ParseElemExprListOpt(&field->elem_segment.elem_exprs);
  } else {
    field->elem_segment.elem_type = Type::FuncRef;
    if (PeekMatch(TokenType::Func)) {
      EXPECT(Func);
    }
    ParseElemExprVarListOpt(&field->elem_segment.elem_exprs);
  }
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}